

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TokenStreamRecognitionException.hpp
# Opt level: O2

string * __thiscall
antlr::TokenStreamRecognitionException::toString_abi_cxx11_
          (string *__return_storage_ptr__,TokenStreamRecognitionException *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  
  RecognitionException::getFileLineColumnString_abi_cxx11_(&local_30,&this->recog);
  (*(this->super_TokenStreamException).super_ANTLRException._vptr_ANTLRException[3])(&local_50,this)
  ;
  std::operator+(__return_storage_ptr__,&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

string toString() const
	{
		return recog.getFileLineColumnString()+getMessage();
	}